

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Cluster::GetTimeCode(Cluster *this)

{
  long in_RDI;
  long status;
  long len;
  longlong pos;
  long *in_stack_00000058;
  longlong *in_stack_00000060;
  Cluster *in_stack_00000068;
  undefined8 local_8;
  
  local_8 = Load(in_stack_00000068,in_stack_00000060,in_stack_00000058);
  if (-1 < local_8) {
    local_8 = *(long *)(in_RDI + 0x28);
  }
  return local_8;
}

Assistant:

long long Cluster::GetTimeCode() const {
  long long pos;
  long len;

  const long status = Load(pos, len);

  if (status < 0)  // error
    return status;

  return m_timecode;
}